

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

double regularizer_direction_magnitude<sparse_parameters>
                 (vw *param_1,bfgs *b,double regularizer,sparse_parameters *weights)

{
  __node_base *p_Var1;
  double dVar2;
  double dVar3;
  
  p_Var1 = &(weights->_map)._M_h._M_before_begin;
  if (b->regularizers == (weight *)0x0) {
    dVar2 = 0.0;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      dVar3 = (double)*(float *)&(*(_Hash_node_base **)
                                   &((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor)[1].
                                 _M_nxt;
      dVar2 = dVar2 + dVar3 * regularizer * dVar3;
    }
  }
  else {
    dVar2 = 0.0;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      dVar3 = (double)*(float *)&(*(_Hash_node_base **)
                                   &((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor)[1].
                                 _M_nxt;
      dVar2 = dVar2 + (double)b->regularizers
                              [((ulong)p_Var1[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) *
                               2] * dVar3 * dVar3;
    }
  }
  return dVar2;
}

Assistant:

double regularizer_direction_magnitude(vw& /* all */, bfgs& b, double regularizer, T& weights)
{
  double ret = 0.;
  if (b.regularizers == nullptr)
    for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
      ret += regularizer * (&(*iter))[W_DIR] * (&(*iter))[W_DIR];

  else
  {
    for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
      ret += ((double)b.regularizers[2 * (iter.index() >> weights.stride_shift())]) * (&(*iter))[W_DIR] *
          (&(*iter))[W_DIR];
  }
  return ret;
}